

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void __thiscall
cmsys::anon_unknown_3::SymbolProperties::SetFunction(SymbolProperties *this,char *function)

{
  void *__ptr;
  char *pcVar1;
  int status;
  size_t bufferLen;
  string result;
  int local_4c;
  undefined8 local_48;
  string local_40 [32];
  
  pcVar1 = "???";
  if (function != (char *)0x0) {
    pcVar1 = function;
  }
  std::__cxx11::string::string(local_40,pcVar1,(allocator *)&local_48);
  local_4c = 0;
  local_48 = 0x400;
  __ptr = malloc(0x400);
  __cxa_demangle(function,__ptr,&local_48,&local_4c);
  if (local_4c == 0) {
    std::__cxx11::string::assign((char *)local_40);
  }
  free(__ptr);
  std::__cxx11::string::operator=((string *)&this->Function,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void SetFunction(const char* function)
  {
    this->Function = this->Demangle(function);
  }